

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ArrayOrRandomizeMethodExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ArrayOrRandomizeMethodExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ParenExpressionListSyntax*&,slang::syntax::ConstraintBlockSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,
          ParenExpressionListSyntax **args_2,ConstraintBlockSyntax **args_3)

{
  Token with;
  ArrayOrRandomizeMethodExpressionSyntax *pAVar1;
  ArrayOrRandomizeMethodExpressionSyntax *in_RCX;
  undefined8 *in_RDX;
  Info *in_RSI;
  BumpAllocator *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pAVar1 = (ArrayOrRandomizeMethodExpressionSyntax *)
           allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  with.info = in_RSI;
  with._0_8_ = in_RDX;
  slang::syntax::ArrayOrRandomizeMethodExpressionSyntax::ArrayOrRandomizeMethodExpressionSyntax
            (in_RCX,(ExpressionSyntax *)in_R8,with,(ParenExpressionListSyntax *)in_RDX[1],
             (ConstraintBlockSyntax *)*in_RDX);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }